

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popt.c
# Opt level: O0

int poptSaveLong(long *arg,uint argInfo,long aLong)

{
  uint uVar1;
  ulong local_28;
  long aLong_local;
  uint argInfo_local;
  long *arg_local;
  
  if ((arg == (long *)0x0) || (((ulong)arg & 7) != 0)) {
    arg_local._4_4_ = -0x14;
  }
  else {
    local_28 = aLong;
    if (((aLong == 0) || ((argInfo & 0x400000) == 0)) ||
       (local_28 = poptRandomValue(aLong), -1 < (long)local_28)) {
      if ((argInfo & 0x1000000) != 0) {
        local_28 = local_28 ^ 0xffffffffffffffff;
      }
      uVar1 = argInfo & 0xe000000;
      if (uVar1 == 0) {
        *arg = local_28;
      }
      else if (uVar1 == 0x2000000) {
        *arg = local_28 ^ *arg;
      }
      else if (uVar1 == 0x4000000) {
        *arg = local_28 & *arg;
      }
      else {
        if (uVar1 != 0x8000000) {
          return -0x13;
        }
        *arg = local_28 | *arg;
      }
      arg_local._4_4_ = 0;
    }
    else {
      arg_local._4_4_ = (int)local_28;
    }
  }
  return arg_local._4_4_;
}

Assistant:

int poptSaveLong(long * arg, unsigned int argInfo, long aLong)
{
    /* XXX Check alignment, may fail on funky platforms. */
    if (arg == NULL || (((unsigned long)arg) & (ALIGNOF(*arg)-1)))
	return POPT_ERROR_NULLARG;

    if (aLong != 0 && LF_ISSET(RANDOM)) {
	aLong = (long)poptRandomValue(aLong);
	if (aLong < 0)
	    return aLong;
    }
    if (LF_ISSET(NOT))
	aLong = ~aLong;
    switch (LF_ISSET(LOGICALOPS)) {
    case 0:		   *arg = aLong; break;
    case POPT_ARGFLAG_OR:  *(unsigned long *)arg |= (unsigned long)aLong; break;
    case POPT_ARGFLAG_AND: *(unsigned long *)arg &= (unsigned long)aLong; break;
    case POPT_ARGFLAG_XOR: *(unsigned long *)arg ^= (unsigned long)aLong; break;
    default:
	return POPT_ERROR_BADOPERATION;
	break;
    }
    return 0;
}